

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O0

void alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  uv_buf_t *buf_local;
  size_t suggested_size_local;
  uv_handle_t *handle_local;
  
  if (((uv_udp_t *)handle != &server) && ((uv_udp_t *)handle != &client)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
            ,0x2c,"(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client");
    abort();
  }
  if (0x10000 < suggested_size) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
            ,0x2d,"suggested_size <= sizeof(slab)");
    abort();
  }
  buf->base = alloc_cb::slab;
  buf->len = 0x10000;
  return;
}

Assistant:

static void alloc_cb(uv_handle_t* handle,
                     size_t suggested_size,
                     uv_buf_t* buf) {
  static char slab[65536];
  CHECK_HANDLE(handle);
  ASSERT(suggested_size <= sizeof(slab));
  buf->base = slab;
  buf->len = sizeof(slab);
}